

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rt_rt.hpp
# Opt level: O2

type * viennamath::result_of::
       mult<viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>,_viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>_>,_false,_false>
       ::instance(type *__return_storage_ptr__,
                 rt_binary_expr<viennamath::rt_expression_interface<double>_> *lhs,
                 rt_unary_expr<viennamath::rt_expression_interface<double>_> *rhs)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  op_interface<viennamath::rt_expression_interface<double>_> *poVar3;
  undefined4 extraout_var_00;
  
  iVar1 = (*(lhs->super_rt_expression_interface<double>)._vptr_rt_expression_interface[2])(lhs);
  poVar3 = (op_interface<viennamath::rt_expression_interface<double>_> *)operator_new(8);
  poVar3->_vptr_op_interface = (_func_int **)&PTR__op_interface_001119e0;
  iVar2 = (*(rhs->super_rt_expression_interface<double>)._vptr_rt_expression_interface[2])(rhs);
  (__return_storage_ptr__->super_rt_expression_interface<double>)._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_binary_expr_00111650;
  (__return_storage_ptr__->lhs_)._M_ptr =
       (rt_expression_interface<double> *)CONCAT44(extraout_var,iVar1);
  (__return_storage_ptr__->op_)._M_ptr = poVar3;
  (__return_storage_ptr__->rhs_)._M_ptr =
       (rt_expression_interface<double> *)CONCAT44(extraout_var_00,iVar2);
  return __return_storage_ptr__;
}

Assistant:

static type instance(LHS const & lhs, RHS const & rhs) { return type(traits::clone<iface_type>(lhs), new op_binary<op_mult<numeric_type>, iface_type>(), traits::clone<iface_type>(rhs)); }